

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::layout_for_variable_abi_cxx11_(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  ExecutionModel EVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  CompilerError *pCVar7;
  char *pcVar8;
  size_t in_RDX;
  bool local_a4a;
  bool local_a49;
  bool local_a48;
  bool local_a46;
  byte local_a45;
  bool local_a43;
  bool local_a42;
  bool local_a41;
  spirv_cross local_810 [38];
  allocator local_7ea;
  undefined1 local_7e9;
  undefined4 local_7e8;
  allocator local_7e2;
  allocator local_7e1;
  string local_7e0 [32];
  char *local_7c0;
  char *fmt;
  undefined1 local_798 [72];
  uint32_t local_750;
  uint32_t local_74c;
  spirv_cross local_748 [34];
  bool local_726;
  bool local_725;
  bool local_724;
  byte local_723;
  bool local_722;
  bool local_721;
  bool can_use_binding;
  ID IStack_720;
  bool can_use_buffer_blocks;
  bool ubo_block;
  bool emulated_ubo;
  bool ssbo_block;
  bool push_constant_block;
  spirv_cross local_718 [32];
  uint32_t local_6f8;
  uint32_t local_6f4;
  spirv_cross local_6f0 [38];
  char local_6ca;
  allocator local_6c9;
  string local_6c8 [39];
  allocator local_6a1;
  string local_6a0 [38];
  undefined1 local_67a;
  allocator local_679;
  string local_678 [39];
  allocator local_651;
  string local_650 [32];
  uint32_t local_630;
  uint32_t local_62c;
  spirv_cross local_628 [32];
  uint32_t local_608;
  uint32_t local_604;
  spirv_cross local_600 [39];
  allocator local_5d9;
  string local_5d8 [38];
  char local_5b2;
  allocator local_5b1;
  string local_5b0 [38];
  char local_58a;
  allocator local_589;
  string local_588 [32];
  uint32_t local_568;
  uint32_t local_564;
  spirv_cross local_560 [32];
  uint32_t local_540;
  uint32_t local_53c;
  spirv_cross local_538 [32];
  uint32_t local_518;
  uint32_t local_514;
  spirv_cross local_510 [32];
  uint32_t local_4f0;
  uint32_t local_4ec;
  spirv_cross local_4e8 [39];
  allocator local_4c1;
  string local_4c0 [38];
  char local_49a;
  allocator local_499;
  string local_498 [38];
  char local_472;
  allocator local_471;
  string local_470 [32];
  spirv_cross local_450 [32];
  spirv_cross local_430 [38];
  char local_40a;
  allocator local_409;
  string local_408 [32];
  uint32_t local_3e8;
  uint32_t local_3e4;
  uint32_t local_3e0;
  uint32_t stride;
  string local_3d8 [36];
  uint32_t local_3b4;
  uint32_t local_3b0;
  uint32_t local_3ac;
  uint32_t buffer_index;
  char local_3a2;
  allocator local_3a1;
  string local_3a0 [36];
  uint32_t local_37c;
  uint32_t local_378;
  uint32_t local_374;
  uint32_t member_geom_stream;
  uint32_t local_36c;
  uint32_t i_1;
  uint32_t local_364;
  uint32_t local_360;
  uint local_35c;
  uint32_t geom_stream;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  bool have_geom_stream;
  bool have_any_xfb_offset;
  bool have_xfb_buffer_stride;
  uint32_t member_count;
  bool uses_enhanced_layouts;
  uint32_t local_324;
  uint32_t local_320;
  uint32_t local_31c;
  spirv_cross local_318 [32];
  Bitset local_2f8;
  uint local_2b4;
  undefined1 local_2b0 [4];
  uint32_t i;
  Bitset combined_decoration;
  uint32_t uStack_264;
  bool is_block;
  spirv_cross local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [36];
  uint32_t local_174;
  Bitset *local_170;
  Bitset *typeflags;
  AlignedBuffer<unsigned_char,_8UL> local_160;
  Bitset *flags;
  SPIRType *type;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  allocator local_21;
  size_t local_20;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  string *res;
  
  local_20 = in_RDX;
  var_local = var;
  this_local = this;
  bVar1 = is_legacy((CompilerGLSL *)var);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(local_20 + 8));
    bVar1 = subpass_input_is_framebuffer_fetch((CompilerGLSL *)var,uVar2);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)this,"",(allocator *)(attr.stack_storage.aligned_char + 0xfb));
      ::std::allocator<char>::~allocator
                ((allocator<char> *)(attr.stack_storage.aligned_char + 0xfb));
    }
    else {
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)(local_20 + 0xc));
      flags = (Bitset *)Compiler::get<spirv_cross::SPIRType>((Compiler *)var,uVar2);
      typeflags._4_4_ = *(uint32_t *)(local_20 + 8);
      local_160.aligned_char =
           (char  [8])Compiler::get_decoration_bitset((Compiler *)var,typeflags._4_4_);
      local_174 = *(uint32_t *)&(flags->higher)._M_h._M_buckets;
      local_170 = Compiler::get_decoration_bitset((Compiler *)var,(ID)local_174);
      bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x1482);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_198,"passthrough",&local_199);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_198);
        ::std::__cxx11::string::~string(local_198);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_199);
      }
      if (((var[0x2b].dereference_chain.stack_storage.aligned_char[0x18] & 1U) == 0) ||
         (*(int *)(local_20 + 0x10) != 9)) {
        if (*(int *)(local_20 + 0x10) == 0x14df) {
          pcVar8 = "shaderRecordNV";
          if ((var[0x35].dereference_chain.stack_storage.aligned_char[0xc] & 1U) != 0) {
            pcVar8 = "shaderRecordEXT";
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1e8,pcVar8,&local_1e9);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1e8);
          ::std::__cxx11::string::~string(local_1e8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        }
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1c0,"push_constant",&local_1c1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1c0);
        ::std::__cxx11::string::~string(local_1c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      }
      bVar1 = Bitset::get((Bitset *)local_160.aligned_char,4);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_210,"row_major",&local_211);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_210);
        ::std::__cxx11::string::~string(local_210);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_211);
      }
      bVar1 = Bitset::get((Bitset *)local_160.aligned_char,5);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_238,"column_major",&local_239);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_238);
        ::std::__cxx11::string::~string(local_238);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_239);
      }
      if (((var[0x2b].dereference_chain.stack_storage.aligned_char[0x18] & 1U) != 0) &&
         (bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x2b), bVar1)) {
        uStack_264 = Compiler::get_decoration
                               ((Compiler *)var,(ID)*(uint32_t *)(local_20 + 8),
                                DecorationInputAttachmentIndex);
        join<char_const(&)[26],unsigned_int>
                  (local_260,(char (*) [26])"input_attachment_index = ",&stack0xfffffffffffffd9c);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_260);
        ::std::__cxx11::string::~string((string *)local_260);
      }
      combined_decoration.higher._M_h._M_single_bucket._0_4_ =
           *(uint32_t *)&(flags->higher)._M_h._M_buckets;
      combined_decoration.higher._M_h._M_single_bucket._7_1_ =
           Compiler::has_decoration
                     ((Compiler *)var,combined_decoration.higher._M_h._M_single_bucket._0_4_,
                      DecorationBlock);
      bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x1e);
      if ((bVar1) &&
         (bVar1 = can_use_io_location((CompilerGLSL *)var,*(StorageClass *)(local_20 + 0x10),
                                      (bool)(combined_decoration.higher._M_h._M_single_bucket._7_1_
                                            & 1)), bVar1)) {
        Bitset::Bitset((Bitset *)local_2b0);
        local_2b4 = 0;
        while( true ) {
          uVar4 = (ulong)local_2b4;
          pmVar5 = ::std::
                   unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                   ::operator[]((unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                                 *)(var[1].dereference_chain.stack_storage.aligned_char + 0x18),
                                (key_type *)&flags->higher);
          sVar6 = VectorView<spirv_cross::Meta::Decoration>::size
                            (&(pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>);
          if (sVar6 <= uVar4) break;
          Compiler::combined_decoration_for_member
                    (&local_2f8,(Compiler *)var,(SPIRType *)flags,local_2b4);
          Bitset::merge_or((Bitset *)local_2b0,&local_2f8);
          Bitset::~Bitset(&local_2f8);
          local_2b4 = local_2b4 + 1;
        }
        bVar1 = Bitset::get((Bitset *)local_2b0,0x1e);
        if (!bVar1) {
          local_320 = *(uint32_t *)(local_20 + 8);
          local_31c = Compiler::get_decoration((Compiler *)var,(ID)local_320,DecorationLocation);
          join<char_const(&)[12],unsigned_int>(local_318,(char (*) [12])"location = ",&local_31c);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_318);
          ::std::__cxx11::string::~string((string *)local_318);
        }
        Bitset::~Bitset((Bitset *)local_2b0);
      }
      EVar3 = Compiler::get_execution_model((Compiler *)var);
      if ((EVar3 == ExecutionModelFragment) && (*(int *)(local_20 + 0x10) == 3)) {
        local_324 = *(uint32_t *)(local_20 + 8);
        uVar2 = Compiler::get_decoration((Compiler *)var,(ID)local_324,DecorationLocation);
        bVar1 = location_is_non_coherent_framebuffer_fetch((CompilerGLSL *)var,uVar2);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&member_count,"noncoherent",(allocator *)&have_xfb_buffer_stride);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &member_count);
          ::std::__cxx11::string::~string((string *)&member_count);
          ::std::allocator<char>::~allocator((allocator<char> *)&have_xfb_buffer_stride);
        }
      }
      have_any_xfb_offset = false;
      if (((combined_decoration.higher._M_h._M_single_bucket._7_1_ & 1) == 0) ||
         (*(int *)(local_20 + 0x10) != 3)) {
        if (*(int *)(local_20 + 0x10) == 3) {
          bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x24);
          if (((bVar1) && (bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x25), bVar1)) &&
             (bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x23), bVar1)) {
            local_518 = *(uint32_t *)(local_20 + 8);
            local_514 = Compiler::get_decoration((Compiler *)var,(ID)local_518,DecorationXfbBuffer);
            join<char_const(&)[14],unsigned_int>
                      (local_510,(char (*) [14])"xfb_buffer = ",&local_514);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_510);
            ::std::__cxx11::string::~string((string *)local_510);
            local_540 = *(uint32_t *)(local_20 + 8);
            local_53c = Compiler::get_decoration((Compiler *)var,(ID)local_540,DecorationXfbStride);
            join<char_const(&)[14],unsigned_int>(local_538,(char (*) [14])0x5e40fd,&local_53c);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_538);
            ::std::__cxx11::string::~string((string *)local_538);
            local_568 = *(uint32_t *)(local_20 + 8);
            local_564 = Compiler::get_decoration((Compiler *)var,(ID)local_568,DecorationOffset);
            join<char_const(&)[14],unsigned_int>(local_560,(char (*) [14])0x5e4161,&local_564);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_560);
            ::std::__cxx11::string::~string((string *)local_560);
            have_any_xfb_offset = true;
          }
          bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x1d);
          if (bVar1) {
            EVar3 = Compiler::get_execution_model((Compiler *)var);
            if (EVar3 != ExecutionModelGeometry) {
              local_58a = '\x01';
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_588,"Geometry streams can only be used in geometry shaders.",
                         &local_589);
              CompilerError::CompilerError(pCVar7,(string *)local_588);
              local_58a = '\0';
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            if ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x10] & 1U) != 0) {
              local_5b2 = '\x01';
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_5b0,"Multiple geometry streams not supported in ESSL.",&local_5b1);
              CompilerError::CompilerError(pCVar7,(string *)local_5b0);
              local_5b2 = '\0';
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            if (*(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc) < 400) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_5d8,"GL_ARB_transform_feedback3",&local_5d9);
              require_extension_internal((CompilerGLSL *)var,(string *)local_5d8);
              ::std::__cxx11::string::~string(local_5d8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
            }
            local_608 = *(uint32_t *)(local_20 + 8);
            local_604 = Compiler::get_decoration((Compiler *)var,(ID)local_608,DecorationStream);
            join<char_const(&)[10],unsigned_int>(local_600,(char (*) [10])"stream = ",&local_604);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_600);
            ::std::__cxx11::string::~string((string *)local_600);
          }
        }
      }
      else {
        sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                           &flags[2].higher);
        xfb_stride = (uint32_t)sVar6;
        xfb_buffer._3_1_ = 0;
        xfb_buffer._2_1_ = 0;
        xfb_buffer._1_1_ = 0;
        geom_stream = 0;
        local_35c = 0;
        local_360 = 0;
        bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x24);
        if ((bVar1) && (bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x25), bVar1)) {
          xfb_buffer._3_1_ = 1;
          local_364 = *(uint32_t *)(local_20 + 8);
          local_35c = Compiler::get_decoration((Compiler *)var,(ID)local_364,DecorationXfbBuffer);
          i_1 = *(uint32_t *)(local_20 + 8);
          geom_stream = Compiler::get_decoration((Compiler *)var,(ID)i_1,DecorationXfbStride);
        }
        bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x1d);
        if (bVar1) {
          xfb_buffer._1_1_ = 1;
          local_36c = *(uint32_t *)(local_20 + 8);
          local_360 = Compiler::get_decoration((Compiler *)var,(ID)local_36c,DecorationStream);
        }
        for (member_geom_stream = 0; member_geom_stream < xfb_stride;
            member_geom_stream = member_geom_stream + 1) {
          local_374 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
          bVar1 = Compiler::has_member_decoration
                            ((Compiler *)var,(TypeID)local_374,member_geom_stream,DecorationStream);
          if (bVar1) {
            local_37c = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
            local_378 = Compiler::get_member_decoration
                                  ((Compiler *)var,(TypeID)local_37c,member_geom_stream,
                                   DecorationStream);
            if (((xfb_buffer._1_1_ & 1) != 0) && (local_378 != local_360)) {
              local_3a2 = '\x01';
              pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_3a0,"IO block member Stream mismatch.",&local_3a1);
              CompilerError::CompilerError(pCVar7,(string *)local_3a0);
              local_3a2 = '\0';
              __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            xfb_buffer._1_1_ = 1;
            local_360 = local_378;
          }
          buffer_index = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
          bVar1 = Compiler::has_member_decoration
                            ((Compiler *)var,(TypeID)buffer_index,member_geom_stream,
                             DecorationOffset);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            xfb_buffer._2_1_ = 1;
            local_3ac = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
            bVar1 = Compiler::has_member_decoration
                              ((Compiler *)var,(TypeID)local_3ac,member_geom_stream,
                               DecorationXfbBuffer);
            if (bVar1) {
              local_3b4 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
              local_3b0 = Compiler::get_member_decoration
                                    ((Compiler *)var,(TypeID)local_3b4,member_geom_stream,
                                     DecorationXfbBuffer);
              if (((xfb_buffer._3_1_ & 1) != 0) && (local_3b0 != local_35c)) {
                stride._2_1_ = 1;
                pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_3d8,"IO block member XfbBuffer mismatch.",
                           (allocator *)((long)&stride + 3));
                CompilerError::CompilerError(pCVar7,(string *)local_3d8);
                stride._2_1_ = 0;
                __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              xfb_buffer._3_1_ = 1;
              local_35c = local_3b0;
            }
            local_3e0 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
            bVar1 = Compiler::has_member_decoration
                              ((Compiler *)var,(TypeID)local_3e0,member_geom_stream,
                               DecorationXfbStride);
            if (bVar1) {
              local_3e8 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&flags->higher);
              local_3e4 = Compiler::get_member_decoration
                                    ((Compiler *)var,(TypeID)local_3e8,member_geom_stream,
                                     DecorationXfbStride);
              if (((xfb_buffer._3_1_ & 1) != 0) && (local_3e4 != geom_stream)) {
                local_40a = '\x01';
                pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_408,"IO block member XfbStride mismatch.",&local_409);
                CompilerError::CompilerError(pCVar7,(string *)local_408);
                local_40a = '\0';
                __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
              }
              xfb_buffer._3_1_ = 1;
              geom_stream = local_3e4;
            }
          }
        }
        if (((xfb_buffer._3_1_ & 1) != 0) && ((xfb_buffer._2_1_ & 1) != 0)) {
          join<char_const(&)[14],unsigned_int&>(local_430,(char (*) [14])"xfb_buffer = ",&local_35c)
          ;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_430);
          ::std::__cxx11::string::~string((string *)local_430);
          join<char_const(&)[14],unsigned_int&>(local_450,(char (*) [14])0x5e40fd,&geom_stream);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_450);
          ::std::__cxx11::string::~string((string *)local_450);
          have_any_xfb_offset = true;
        }
        if ((xfb_buffer._1_1_ & 1) != 0) {
          EVar3 = Compiler::get_execution_model((Compiler *)var);
          if (EVar3 != ExecutionModelGeometry) {
            local_472 = '\x01';
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_470,"Geometry streams can only be used in geometry shaders.",&local_471
                      );
            CompilerError::CompilerError(pCVar7,(string *)local_470);
            local_472 = '\0';
            __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x10] & 1U) != 0) {
            local_49a = '\x01';
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_498,"Multiple geometry streams not supported in ESSL.",&local_499);
            CompilerError::CompilerError(pCVar7,(string *)local_498);
            local_49a = '\0';
            __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (*(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc) < 400) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_4c0,"GL_ARB_transform_feedback3",&local_4c1);
            require_extension_internal((CompilerGLSL *)var,(string *)local_4c0);
            ::std::__cxx11::string::~string(local_4c0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
          }
          local_4f0 = *(uint32_t *)(local_20 + 8);
          local_4ec = Compiler::get_decoration((Compiler *)var,(ID)local_4f0,DecorationStream);
          join<char_const(&)[10],unsigned_int>(local_4e8,(char (*) [10])"stream = ",&local_4ec);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4e8);
          ::std::__cxx11::string::~string((string *)local_4e8);
        }
      }
      bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x1f);
      if ((bVar1) &&
         (bVar1 = can_use_io_location((CompilerGLSL *)var,*(StorageClass *)(local_20 + 0x10),
                                      (bool)(combined_decoration.higher._M_h._M_single_bucket._7_1_
                                            & 1)), bVar1)) {
        have_any_xfb_offset = true;
        local_630 = *(uint32_t *)(local_20 + 8);
        local_62c = Compiler::get_decoration((Compiler *)var,(ID)local_630,DecorationComponent);
        join<char_const(&)[13],unsigned_int>(local_628,(char (*) [13])"component = ",&local_62c);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_628);
        ::std::__cxx11::string::~string((string *)local_628);
      }
      if ((have_any_xfb_offset & 1U) != 0) {
        if ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x10] & 1U) == 0) {
          if ((*(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc) < 0x1b8) &&
             (0x8b < *(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc))) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_650,"GL_ARB_enhanced_layouts",&local_651);
            require_extension_internal((CompilerGLSL *)var,(string *)local_650);
            ::std::__cxx11::string::~string(local_650);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_651);
          }
          else if (*(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc) < 0x8c) {
            local_67a = 1;
            pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_678,
                       "GL_ARB_enhanced_layouts is not supported in targets below GLSL 1.40.",
                       &local_679);
            CompilerError::CompilerError(pCVar7,(string *)local_678);
            local_67a = 0;
            __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          if (((var[0x2b].dereference_chain.stack_storage.aligned_char[0x10] & 1U) == 0) &&
             (*(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc) < 0x1b8)) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_6a0,"GL_ARB_enhanced_layouts",&local_6a1);
            require_extension_internal((CompilerGLSL *)var,(string *)local_6a0);
            ::std::__cxx11::string::~string(local_6a0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
          }
        }
        else if ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x10] & 1U) != 0) {
          local_6ca = '\x01';
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_6c8,"GL_ARB_enhanced_layouts is not supported in ESSL.",&local_6c9);
          CompilerError::CompilerError(pCVar7,(string *)local_6c8);
          local_6ca = '\0';
          __cxa_throw(pCVar7,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x20);
      if (bVar1) {
        local_6f8 = *(uint32_t *)(local_20 + 8);
        local_6f4 = Compiler::get_decoration((Compiler *)var,(ID)local_6f8,DecorationIndex);
        join<char_const(&)[9],unsigned_int>(local_6f0,(char (*) [9])0x5e2c19,&local_6f4);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_6f0);
        ::std::__cxx11::string::~string((string *)local_6f0);
      }
      if ((((*(int *)(local_20 + 0x10) != 9) && (*(int *)(local_20 + 0x10) != 0x14df)) &&
          (bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x22), bVar1)) &&
         ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x18] & 1U) != 0)) {
        IStack_720.id = *(uint32_t *)(local_20 + 8);
        _ubo_block = Compiler::get_decoration((Compiler *)var,IStack_720,DecorationDescriptorSet);
        join<char_const(&)[7],unsigned_int>(local_718,(char (*) [7])0x5e4168,(uint *)&ubo_block);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_718);
        ::std::__cxx11::string::~string((string *)local_718);
      }
      local_a41 = false;
      if ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x18] & 1U) != 0) {
        local_a41 = *(int *)(local_20 + 0x10) == 9;
      }
      local_721 = local_a41;
      local_a42 = true;
      if ((*(int *)(local_20 + 0x10) != 0xc) &&
         (local_a42 = true, *(int *)(local_20 + 0x10) != 0x14df)) {
        local_a43 = false;
        if (*(int *)(local_20 + 0x10) == 2) {
          local_a43 = Bitset::get(local_170,3);
        }
        local_a42 = local_a43;
      }
      local_722 = local_a42;
      local_a45 = 0;
      if (*(int *)(local_20 + 0x10) == 9) {
        local_a45 = var[0x2b].dereference_chain.stack_storage.aligned_char[0x1c];
      }
      local_723 = local_a45 & 1;
      local_a46 = false;
      if (*(int *)(local_20 + 0x10) == 2) {
        local_a46 = Bitset::get(local_170,2);
      }
      local_724 = local_a46;
      if (((var[0x2b].dereference_chain.stack_storage.aligned_char[0x10] & 1U) == 0) ||
         (local_a48 = true,
         *(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc) < 300)) {
        local_a49 = false;
        if ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x10] & 1U) == 0) {
          local_a49 = 0x8b < *(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc)
          ;
        }
        local_a48 = local_a49;
      }
      local_725 = local_a48;
      if ((local_a46 != false) &&
         ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x1d] & 1U) != 0)) {
        local_725 = false;
      }
      if ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x10] & 1U) == 0) {
        local_a4a = true;
        if ((var[0x2b].dereference_chain.stack_storage.aligned_char[0x1b] & 1U) == 0) {
          local_a4a = 0x1a3 < *(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc
                                       );
        }
        local_726 = local_a4a;
      }
      else {
        local_726 = 0x135 < *(uint *)(var[0x2b].dereference_chain.stack_storage.aligned_char + 0xc);
      }
      if ((local_725 == false) && (*(int *)(local_20 + 0x10) == 2)) {
        local_726 = false;
      }
      if (*(int *)(local_20 + 0x10) == 0x14df) {
        local_726 = false;
      }
      if ((local_726 != false) &&
         (bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x21), bVar1)) {
        local_750 = *(uint32_t *)(local_20 + 8);
        local_74c = Compiler::get_decoration((Compiler *)var,(ID)local_750,DecorationBinding);
        join<char_const(&)[11],unsigned_int>(local_748,(char (*) [11])"binding = ",&local_74c);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_748);
        ::std::__cxx11::string::~string((string *)local_748);
      }
      if ((*(int *)(local_20 + 0x10) != 3) &&
         (bVar1 = Bitset::get((Bitset *)local_160.aligned_char,0x23), bVar1)) {
        local_798._32_4_ = *(uint32_t *)(local_20 + 8);
        local_798._36_4_ =
             Compiler::get_decoration((Compiler *)var,(ID)local_798._32_4_,DecorationOffset);
        join<char_const(&)[10],unsigned_int>
                  ((spirv_cross *)(local_798 + 0x28),(char (*) [10])0x5e4165,
                   (uint *)(local_798 + 0x24));
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_798 + 0x28));
        ::std::__cxx11::string::~string((string *)(local_798 + 0x28));
      }
      if (((local_725 & 1U) == 0) || (((local_724 & 1U) == 0 && ((local_723 & 1) == 0)))) {
        if (((local_725 & 1U) != 0) && (((local_721 & 1U) != 0 || ((local_722 & 1U) != 0)))) {
          buffer_to_packing_standard_abi_cxx11_((CompilerGLSL *)&fmt,(SPIRType *)var,SUB81(flags,0))
          ;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fmt);
          ::std::__cxx11::string::~string((string *)&fmt);
        }
      }
      else {
        buffer_to_packing_standard_abi_cxx11_
                  ((CompilerGLSL *)local_798,(SPIRType *)var,SUB81(flags,0));
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_798);
        ::std::__cxx11::string::~string((string *)local_798);
      }
      if (((*(int *)((long)&(flags->higher)._M_h._M_buckets + 4) == 0x10) &&
          (*(int *)((long)&flags[4].lower + 4) == 2)) &&
         (pcVar8 = format_to_glsl((CompilerGLSL *)var,
                                  *(ImageFormat *)&flags[4].higher._M_h._M_buckets),
         local_7c0 = pcVar8, pcVar8 != (char *)0x0)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_7e0,pcVar8,&local_7e1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&type,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_7e0);
        ::std::__cxx11::string::~string(local_7e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
      }
      bVar1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&type);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_7e2);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7e2);
      }
      else {
        local_7e9 = 0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"layout(",&local_7ea);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7ea);
        merge(local_810,
              (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)&type,", ");
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_810);
        ::std::__cxx11::string::~string((string *)local_810);
        ::std::__cxx11::string::operator+=((string *)this,") ");
        local_7e9 = 1;
      }
      local_7e8 = 1;
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)&type);
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::layout_for_variable(const SPIRVariable &var)
{
	// FIXME: Come up with a better solution for when to disable layouts.
	// Having layouts depend on extensions as well as which types
	// of layouts are used. For now, the simple solution is to just disable
	// layouts for legacy versions.
	if (is_legacy())
		return "";

	if (subpass_input_is_framebuffer_fetch(var.self))
		return "";

	SmallVector<string> attr;

	auto &type = get<SPIRType>(var.basetype);
	auto &flags = get_decoration_bitset(var.self);
	auto &typeflags = get_decoration_bitset(type.self);

	if (flags.get(DecorationPassthroughNV))
		attr.push_back("passthrough");

	if (options.vulkan_semantics && var.storage == StorageClassPushConstant)
		attr.push_back("push_constant");
	else if (var.storage == StorageClassShaderRecordBufferKHR)
		attr.push_back(ray_tracing_is_khr ? "shaderRecordEXT" : "shaderRecordNV");

	if (flags.get(DecorationRowMajor))
		attr.push_back("row_major");
	if (flags.get(DecorationColMajor))
		attr.push_back("column_major");

	if (options.vulkan_semantics)
	{
		if (flags.get(DecorationInputAttachmentIndex))
			attr.push_back(join("input_attachment_index = ", get_decoration(var.self, DecorationInputAttachmentIndex)));
	}

	bool is_block = has_decoration(type.self, DecorationBlock);
	if (flags.get(DecorationLocation) && can_use_io_location(var.storage, is_block))
	{
		Bitset combined_decoration;
		for (uint32_t i = 0; i < ir.meta[type.self].members.size(); i++)
			combined_decoration.merge_or(combined_decoration_for_member(type, i));

		// If our members have location decorations, we don't need to
		// emit location decorations at the top as well (looks weird).
		if (!combined_decoration.get(DecorationLocation))
			attr.push_back(join("location = ", get_decoration(var.self, DecorationLocation)));
	}

	if (get_execution_model() == ExecutionModelFragment && var.storage == StorageClassOutput &&
	    location_is_non_coherent_framebuffer_fetch(get_decoration(var.self, DecorationLocation)))
	{
		attr.push_back("noncoherent");
	}

	// Transform feedback
	bool uses_enhanced_layouts = false;
	if (is_block && var.storage == StorageClassOutput)
	{
		// For blocks, there is a restriction where xfb_stride/xfb_buffer must only be declared on the block itself,
		// since all members must match the same xfb_buffer. The only thing we will declare for members of the block
		// is the xfb_offset.
		uint32_t member_count = uint32_t(type.member_types.size());
		bool have_xfb_buffer_stride = false;
		bool have_any_xfb_offset = false;
		bool have_geom_stream = false;
		uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;

		if (flags.get(DecorationXfbBuffer) && flags.get(DecorationXfbStride))
		{
			have_xfb_buffer_stride = true;
			xfb_buffer = get_decoration(var.self, DecorationXfbBuffer);
			xfb_stride = get_decoration(var.self, DecorationXfbStride);
		}

		if (flags.get(DecorationStream))
		{
			have_geom_stream = true;
			geom_stream = get_decoration(var.self, DecorationStream);
		}

		// Verify that none of the members violate our assumption.
		for (uint32_t i = 0; i < member_count; i++)
		{
			if (has_member_decoration(type.self, i, DecorationStream))
			{
				uint32_t member_geom_stream = get_member_decoration(type.self, i, DecorationStream);
				if (have_geom_stream && member_geom_stream != geom_stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = member_geom_stream;
			}

			// Only members with an Offset decoration participate in XFB.
			if (!has_member_decoration(type.self, i, DecorationOffset))
				continue;
			have_any_xfb_offset = true;

			if (has_member_decoration(type.self, i, DecorationXfbBuffer))
			{
				uint32_t buffer_index = get_member_decoration(type.self, i, DecorationXfbBuffer);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
			}

			if (has_member_decoration(type.self, i, DecorationXfbStride))
			{
				uint32_t stride = get_member_decoration(type.self, i, DecorationXfbStride);
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbStride mismatch.");
				have_xfb_buffer_stride = true;
				xfb_stride = stride;
			}
		}

		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			attr.push_back(join("xfb_buffer = ", xfb_buffer));
			attr.push_back(join("xfb_stride = ", xfb_stride));
			uses_enhanced_layouts = true;
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", get_decoration(var.self, DecorationStream)));
		}
	}
	else if (var.storage == StorageClassOutput)
	{
		if (flags.get(DecorationXfbBuffer) && flags.get(DecorationXfbStride) && flags.get(DecorationOffset))
		{
			// XFB for standalone variables, we can emit all decorations.
			attr.push_back(join("xfb_buffer = ", get_decoration(var.self, DecorationXfbBuffer)));
			attr.push_back(join("xfb_stride = ", get_decoration(var.self, DecorationXfbStride)));
			attr.push_back(join("xfb_offset = ", get_decoration(var.self, DecorationOffset)));
			uses_enhanced_layouts = true;
		}

		if (flags.get(DecorationStream))
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", get_decoration(var.self, DecorationStream)));
		}
	}

	// Can only declare Component if we can declare location.
	if (flags.get(DecorationComponent) && can_use_io_location(var.storage, is_block))
	{
		uses_enhanced_layouts = true;
		attr.push_back(join("component = ", get_decoration(var.self, DecorationComponent)));
	}

	if (uses_enhanced_layouts)
	{
		if (!options.es)
		{
			if (options.version < 440 && options.version >= 140)
				require_extension_internal("GL_ARB_enhanced_layouts");
			else if (options.version < 140)
				SPIRV_CROSS_THROW("GL_ARB_enhanced_layouts is not supported in targets below GLSL 1.40.");
			if (!options.es && options.version < 440)
				require_extension_internal("GL_ARB_enhanced_layouts");
		}
		else if (options.es)
			SPIRV_CROSS_THROW("GL_ARB_enhanced_layouts is not supported in ESSL.");
	}

	if (flags.get(DecorationIndex))
		attr.push_back(join("index = ", get_decoration(var.self, DecorationIndex)));

	// Do not emit set = decoration in regular GLSL output, but
	// we need to preserve it in Vulkan GLSL mode.
	if (var.storage != StorageClassPushConstant && var.storage != StorageClassShaderRecordBufferKHR)
	{
		if (flags.get(DecorationDescriptorSet) && options.vulkan_semantics)
			attr.push_back(join("set = ", get_decoration(var.self, DecorationDescriptorSet)));
	}

	bool push_constant_block = options.vulkan_semantics && var.storage == StorageClassPushConstant;
	bool ssbo_block = var.storage == StorageClassStorageBuffer || var.storage == StorageClassShaderRecordBufferKHR ||
	                  (var.storage == StorageClassUniform && typeflags.get(DecorationBufferBlock));
	bool emulated_ubo = var.storage == StorageClassPushConstant && options.emit_push_constant_as_uniform_buffer;
	bool ubo_block = var.storage == StorageClassUniform && typeflags.get(DecorationBlock);

	// GL 3.0/GLSL 1.30 is not considered legacy, but it doesn't have UBOs ...
	bool can_use_buffer_blocks = (options.es && options.version >= 300) || (!options.es && options.version >= 140);

	// pretend no UBOs when options say so
	if (ubo_block && options.emit_uniform_buffer_as_plain_uniforms)
		can_use_buffer_blocks = false;

	bool can_use_binding;
	if (options.es)
		can_use_binding = options.version >= 310;
	else
		can_use_binding = options.enable_420pack_extension || (options.version >= 420);

	// Make sure we don't emit binding layout for a classic uniform on GLSL 1.30.
	if (!can_use_buffer_blocks && var.storage == StorageClassUniform)
		can_use_binding = false;

	if (var.storage == StorageClassShaderRecordBufferKHR)
		can_use_binding = false;

	if (can_use_binding && flags.get(DecorationBinding))
		attr.push_back(join("binding = ", get_decoration(var.self, DecorationBinding)));

	if (var.storage != StorageClassOutput && flags.get(DecorationOffset))
		attr.push_back(join("offset = ", get_decoration(var.self, DecorationOffset)));

	// Instead of adding explicit offsets for every element here, just assume we're using std140 or std430.
	// If SPIR-V does not comply with either layout, we cannot really work around it.
	if (can_use_buffer_blocks && (ubo_block || emulated_ubo))
	{
		attr.push_back(buffer_to_packing_standard(type, false));
	}
	else if (can_use_buffer_blocks && (push_constant_block || ssbo_block))
	{
		attr.push_back(buffer_to_packing_standard(type, true));
	}

	// For images, the type itself adds a layout qualifer.
	// Only emit the format for storage images.
	if (type.basetype == SPIRType::Image && type.image.sampled == 2)
	{
		const char *fmt = format_to_glsl(type.image.format);
		if (fmt)
			attr.push_back(fmt);
	}

	if (attr.empty())
		return "";

	string res = "layout(";
	res += merge(attr);
	res += ") ";
	return res;
}